

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTest::initPrograms
          (GraphicsCacheTest *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkShaderStageFlagBits VVar2;
  ProgramSources *pPVar3;
  ulong uVar4;
  long *local_a0;
  long local_98;
  long local_90 [2];
  string local_80;
  uint local_60;
  value_type local_58;
  GraphicsCacheTest *local_38;
  
  if ((int)(this->super_CacheTest).m_param.m_shaderCount != 0) {
    paVar1 = &local_58.field_2;
    uVar4 = 0;
    local_38 = this;
    do {
      VVar2 = (this->super_CacheTest).m_param.m_shaders[uVar4];
      switch(VVar2) {
      case VK_SHADER_STAGE_VERTEX_BIT:
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"color_vert","");
        pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                           (&programCollection->glslSources,&local_80);
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,
                   "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n  gl_Position = position;\n  vtxColor = color;\n}\n"
                   ,"");
        local_60 = 0;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_a0,local_98 + (long)local_a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pPVar3->sources + local_60,&local_58);
        break;
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"basic_tcs","");
        pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                           (&programCollection->glslSources,&local_80);
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,
                   "#version 450 \nlayout(vertices = 3) out;\nlayout(location = 0) in highp vec4 color[];\nlayout(location = 0) out highp vec4 vtxColor[];\nout gl_PerVertex { vec4 gl_Position; } gl_out[3];\nin gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\nvoid main()\n{\n  gl_TessLevelOuter[0] = 4.0;\n  gl_TessLevelOuter[1] = 4.0;\n  gl_TessLevelOuter[2] = 4.0;\n  gl_TessLevelInner[0] = 4.0;\n  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n}\n"
                   ,"");
        local_60 = 3;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_a0,local_98 + (long)local_a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pPVar3->sources + local_60,&local_58);
        break;
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
           VK_SHADER_STAGE_VERTEX_BIT:
        goto switchD_004a38ba_caseD_3;
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"basic_tes","");
        pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                           (&programCollection->glslSources,&local_80);
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,
                   "#version 450 \nlayout(triangles, fractional_even_spacing, ccw) in;\nlayout(location = 0) in highp vec4 colors[];\nlayout(location = 0) out highp vec4 vtxColor;\nout gl_PerVertex { vec4 gl_Position; };\nin gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\nvoid main() \n{\n  float u = gl_TessCoord.x;\n  float v = gl_TessCoord.y;\n  float w = gl_TessCoord.z;\n  vec4 pos = vec4(0);\n  vec4 color = vec4(0);\n  pos.xyz += u * gl_in[0].gl_Position.xyz;\n  color.xyz += u * colors[0].xyz;\n  pos.xyz += v * gl_in[1].gl_Position.xyz;\n  color.xyz += v * colors[1].xyz;\n  pos.xyz += w * gl_in[2].gl_Position.xyz;\n  color.xyz += w * colors[2].xyz;\n  pos.w = 1.0;\n  color.w = 1.0;\n  gl_Position = pos;\n  vtxColor = color;\n}\n"
                   ,"");
        local_60 = 4;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_a0,local_98 + (long)local_a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pPVar3->sources + local_60,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        this = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) goto switchD_004a38ba_caseD_3;
        goto LAB_004a3c52;
      case VK_SHADER_STAGE_GEOMETRY_BIT:
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"dummy_geo","");
        pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                           (&programCollection->glslSources,&local_80);
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,
                   "#version 450 \nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\nlayout(location = 0) in highp vec4 in_vtxColor[];\nlayout(location = 0) out highp vec4 vtxColor;\nout gl_PerVertex { vec4 gl_Position; };\nin gl_PerVertex { vec4 gl_Position; } gl_in[];\nvoid main (void)\n{\n  for(int ndx=0; ndx<3; ndx++)\n  {\n    gl_Position = gl_in[ndx].gl_Position;\n    vtxColor    = in_vtxColor[ndx];\n    EmitVertex();\n  }\n  EndPrimitive();\n}\n"
                   ,"");
        local_60 = 2;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_a0,local_98 + (long)local_a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pPVar3->sources + local_60,&local_58);
        break;
      default:
        if (VVar2 == VK_SHADER_STAGE_FRAGMENT_BIT) {
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"color_frag","");
          pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                             (&programCollection->glslSources,&local_80);
          local_a0 = local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,
                     "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n  fragColor = vtxColor;\n}\n"
                     ,"");
          local_60 = 1;
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_a0,local_98 + (long)local_a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pPVar3->sources + local_60,&local_58);
          break;
        }
        goto switchD_004a38ba_caseD_3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      this = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_004a3c52:
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        this = local_38;
      }
switchD_004a38ba_caseD_3:
      uVar4 = uVar4 + 1;
    } while (uVar4 < (uint)(this->super_CacheTest).m_param.m_shaderCount);
  }
  return;
}

Assistant:

void GraphicsCacheTest::initPrograms (SourceCollections& programCollection) const
{
	for (deUint32 shaderNdx = 0; shaderNdx < m_param.getShaderCount(); shaderNdx++)
	{
		switch(m_param.getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				programCollection.glslSources.add("color_vert") << glu::VertexSource(
					"#version 310 es\n"
					"layout(location = 0) in vec4 position;\n"
					"layout(location = 1) in vec4 color;\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"void main (void)\n"
					"{\n"
					"  gl_Position = position;\n"
					"  vtxColor = color;\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_FRAGMENT_BIT:
				programCollection.glslSources.add("color_frag") << glu::FragmentSource(
					"#version 310 es\n"
					"layout(location = 0) in highp vec4 vtxColor;\n"
					"layout(location = 0) out highp vec4 fragColor;\n"
					"void main (void)\n"
					"{\n"
					"  fragColor = vtxColor;\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_GEOMETRY_BIT:
				programCollection.glslSources.add("dummy_geo") << glu::GeometrySource(
					"#version 450 \n"
					"layout(triangles) in;\n"
					"layout(triangle_strip, max_vertices = 3) out;\n"
					"layout(location = 0) in highp vec4 in_vtxColor[];\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"out gl_PerVertex { vec4 gl_Position; };\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n"
					"void main (void)\n"
					"{\n"
					"  for(int ndx=0; ndx<3; ndx++)\n"
					"  {\n"
					"    gl_Position = gl_in[ndx].gl_Position;\n"
					"    vtxColor    = in_vtxColor[ndx];\n"
					"    EmitVertex();\n"
					"  }\n"
					"  EndPrimitive();\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				programCollection.glslSources.add("basic_tcs") << glu::TessellationControlSource(
					"#version 450 \n"
					"layout(vertices = 3) out;\n"
					"layout(location = 0) in highp vec4 color[];\n"
					"layout(location = 0) out highp vec4 vtxColor[];\n"
					"out gl_PerVertex { vec4 gl_Position; } gl_out[3];\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\n"
					"void main()\n"
					"{\n"
					"  gl_TessLevelOuter[0] = 4.0;\n"
					"  gl_TessLevelOuter[1] = 4.0;\n"
					"  gl_TessLevelOuter[2] = 4.0;\n"
					"  gl_TessLevelInner[0] = 4.0;\n"
					"  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					"  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				programCollection.glslSources.add("basic_tes") << glu::TessellationEvaluationSource(
					"#version 450 \n"
					"layout(triangles, fractional_even_spacing, ccw) in;\n"
					"layout(location = 0) in highp vec4 colors[];\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"out gl_PerVertex { vec4 gl_Position; };\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\n"
					"void main() \n"
					"{\n"
					"  float u = gl_TessCoord.x;\n"
					"  float v = gl_TessCoord.y;\n"
					"  float w = gl_TessCoord.z;\n"
					"  vec4 pos = vec4(0);\n"
					"  vec4 color = vec4(0);\n"
					"  pos.xyz += u * gl_in[0].gl_Position.xyz;\n"
					"  color.xyz += u * colors[0].xyz;\n"
					"  pos.xyz += v * gl_in[1].gl_Position.xyz;\n"
					"  color.xyz += v * colors[1].xyz;\n"
					"  pos.xyz += w * gl_in[2].gl_Position.xyz;\n"
					"  color.xyz += w * colors[2].xyz;\n"
					"  pos.w = 1.0;\n"
					"  color.w = 1.0;\n"
					"  gl_Position = pos;\n"
					"  vtxColor = color;\n"
					"}\n");
				break;

			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}
}